

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::UnpackInlinedValueRep
          (CrateReader *this,ValueRep *rep,CrateValue *value)

{
  ulong uVar1;
  ulong uVar2;
  half hVar3;
  ostream *poVar4;
  value_type *pvVar5;
  error_type *peVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char cVar8;
  CrateDataTypeId did;
  CrateDataTypeId did_00;
  char cVar11;
  char *pcVar12;
  crate *this_00;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qb;
  optional<tinyusdz::Token> v_1;
  string str_1;
  ostringstream ss_e;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  allocator local_245;
  float local_244;
  optional<tinyusdz::Token> local_240;
  string local_218;
  undefined1 local_1f8 [4];
  undefined4 uStack_1f4;
  undefined8 uStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider _Stack_1d8;
  double local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c8;
  double dStack_1b8;
  double local_1b0;
  double dStack_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  double dStack_188;
  double local_180;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_50;
  char cVar9;
  Index token_index;
  int iVar10;
  
  if ((rep->data >> 0x3e & 1) == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x71b);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)local_1f8,"ValueRep must be inlined value representation."
                              );
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    return false;
  }
  GetCrateDataType_abi_cxx11_(&local_78,(crate *)(rep->data >> 0x30 & 0xff),(int32_t)value);
  if (local_78.contained.
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == false) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x721);
    ::std::operator<<(poVar4," ");
    peVar6 = nonstd::expected_lite::
             expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&local_78);
    poVar4 = ::std::operator<<((ostream *)local_1f8,(string *)peVar6);
    goto LAB_00180807;
  }
  if ((rep->data >> 0x3d & 1) != 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x726);
    ::std::operator<<(poVar4," ");
    pcVar12 = "Inlinved value must not be compressed.";
    goto LAB_001807ff;
  }
  if ((long)rep->data < 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x72b);
    ::std::operator<<(poVar4," ");
    pcVar12 = "Inlined value must not be an array.";
    goto LAB_001807ff;
  }
  pvVar5 = nonstd::expected_lite::
           expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::value(&local_78);
  this_00 = (crate *)(ulong)pvVar5->dtype_id;
  if ((crate *)0x39 < this_00) goto LAB_0018084a;
  uVar1 = rep->data;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&switchD_001805e5::switchdataD_002e2bf4 +
         (long)(int)(&switchD_001805e5::switchdataD_002e2bf4)[(long)this_00]);
  cVar8 = (char)uVar1;
  token_index.value = (uint32_t)uVar1;
  iVar10 = (int)token_index.value >> 0x18;
  cVar11 = (char)(uVar1 >> 8);
  cVar9 = (char)(uVar1 >> 0x10);
  switch(this_00) {
  case (crate *)0x0:
  case (crate *)0x39:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x739);
    ::std::operator<<(poVar4," ");
    pcVar12 = "`Invalid` DataType.";
    goto LAB_001807ff;
  case (crate *)0x1:
    local_1f8[0] = token_index.value != 0;
    linb::any::operator=((any *)value,(bool *)local_1f8);
    break;
  case (crate *)0x2:
    _local_1f8 = (_Type)(CONCAT44(uStack_1f4,token_index.value) & 0xffffffff000000ff);
    goto LAB_00180da4;
  case (crate *)0x3:
    local_1f8._0_2_ = (short)token_index.value;
    local_1f8._2_2_ = (short)(token_index.value >> 0x10);
LAB_00180da4:
    linb::any::operator=((any *)value,(int *)local_1f8);
    break;
  case (crate *)0x4:
    local_1f8._0_2_ = (short)token_index.value;
    local_1f8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(uint *)local_1f8);
    break;
  case (crate *)0x5:
    _local_1f8 = (_Type)(long)(int)token_index.value;
    linb::any::operator=((any *)value,(long *)local_1f8);
    break;
  case (crate *)0x6:
    _local_1f8 = (_Type)(uVar1 & 0xffffffff);
    linb::any::operator=((any *)value,(unsigned_long *)local_1f8);
    break;
  case (crate *)0x7:
    local_1f8._0_2_ = (uint16_t)uVar1;
    linb::any::operator=((any *)value,(half *)local_1f8);
    break;
  case (crate *)0x8:
    local_1f8._0_2_ = (short)token_index.value;
    local_1f8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(float *)local_1f8);
    break;
  case (crate *)0x9:
    _local_1f8 = (_Type)(double)(float)token_index.value;
    linb::any::operator=((any *)value,(double *)local_1f8);
    break;
  case (crate *)0xa:
    GetStringToken(&local_240,this,token_index);
    cVar11 = local_240.has_value_;
    if (local_240.has_value_ == true) {
      psVar7 = (string *)nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_240);
      ::std::__cxx11::string::string((string *)local_1f8,psVar7);
      linb::any::operator=
                ((any *)value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
      goto LAB_00180eca;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x765);
    ::std::operator<<(poVar4," ");
    pcVar12 = "Invalid Index for StringToken.";
LAB_001812ab:
    poVar4 = ::std::operator<<((ostream *)local_1f8,pcVar12);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    goto LAB_001812f6;
  case (crate *)0xb:
    GetToken(&local_240,this,token_index);
    cVar11 = local_240.has_value_;
    if (local_240.has_value_ != true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x757);
      ::std::operator<<(poVar4," ");
      pcVar12 = "Invalid Index for Token.";
      goto LAB_001812ab;
    }
    psVar7 = (string *)nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_240);
    ::std::__cxx11::string::string((string *)local_1f8,psVar7);
    linb::any::operator=((any *)value,(Token *)local_1f8);
    goto LAB_00180eca;
  case (crate *)0xc:
    GetToken(&local_240,this,token_index);
    cVar11 = local_240.has_value_;
    if (local_240.has_value_ != true) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x749);
      ::std::operator<<(poVar4," ");
      pcVar12 = "Invalid Index for AssetPath.";
      goto LAB_001812ab;
    }
    psVar7 = (string *)nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_240);
    ::std::__cxx11::string::string((string *)&local_218,psVar7);
    tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_1f8,&local_218);
    linb::any::operator=((any *)value,(AssetPath *)local_1f8);
    tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_1f8);
LAB_00180eca:
    ::std::__cxx11::string::_M_dispose();
LAB_001812f6:
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_240);
    goto LAB_0018084c;
  case (crate *)0xd:
    uStack_1f0 = 0.0;
    local_1e8._M_allocated_capacity = 0;
    _local_1f8 = (_Type)(double)(int)cVar8;
    local_1e8._8_8_ = (undefined8)(int)cVar11;
    linb::any::operator=((any *)value,(matrix2d *)local_1f8);
    break;
  case (crate *)0xe:
    local_1e8._8_8_ = (undefined8 *)0x0;
    local_1d0 = 0.0;
    aStack_1c8._M_allocated_capacity = 0;
    uStack_1f0 = 0.0;
    local_1e8._M_allocated_capacity = 0;
    aStack_1c8._8_8_ = 0.0;
    _local_1f8 = (_Type)(double)(int)cVar8;
    _Stack_1d8._M_p = (pointer)(double)(int)cVar11;
    dStack_1b8 = (double)(int)cVar9;
    linb::any::operator=((any *)value,(matrix3d *)local_1f8);
    break;
  case (crate *)0xf:
    aStack_1c8._M_allocated_capacity = 0;
    local_1b0 = 0.0;
    local_190 = 0.0;
    dStack_188 = 0.0;
    local_1a0 = 0.0;
    dStack_198 = 0.0;
    aStack_1c8._8_8_ = 0.0;
    dStack_1b8 = 0.0;
    local_1e8._8_8_ = (undefined8 *)0x0;
    _Stack_1d8._M_p = (pointer)0x0;
    uStack_1f0 = 0.0;
    local_1e8._M_allocated_capacity = 0;
    _local_1f8 = (_Type)(double)(int)cVar8;
    local_1d0 = (double)(int)cVar11;
    dStack_1a8 = (double)(int)cVar9;
    local_180 = (double)iVar10;
    linb::any::operator=((any *)value,(matrix4d *)local_1f8);
    break;
  case (crate *)0x10:
  case (crate *)0x11:
  case (crate *)0x12:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x81e);
    ::std::operator<<(poVar4," ");
    pcVar12 = "Quaternion type is not allowed for Inlined Value.";
LAB_001807ff:
    poVar4 = ::std::operator<<((ostream *)local_1f8,pcVar12);
LAB_00180807:
    ::std::operator<<(poVar4,"\n");
LAB_00180816:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
LAB_0018084a:
    cVar11 = '\0';
    goto LAB_0018084c;
  case (crate *)0x13:
    _local_1f8 = (_Type)(double)(int)cVar8;
    uStack_1f0 = (double)(int)((long)(uVar1 << 0x30) >> 0x38);
    linb::any::operator=((any *)value,(array<double,_2UL> *)local_1f8);
    break;
  case (crate *)0x14:
    local_1f8 = (undefined1  [4])(float)(int)cVar8;
    uStack_1f4 = (float)(int)((long)(uVar1 << 0x30) >> 0x38);
    linb::any::operator=((any *)value,(array<float,_2UL> *)local_1f8);
    break;
  case (crate *)0x15:
    hVar3 = tinyusdz::value::float_to_half_full((float)(int)cVar8);
    local_1f8._0_2_ = hVar3.value;
    hVar3 = tinyusdz::value::float_to_half_full((float)(int)cVar11);
    local_1f8._2_2_ = hVar3.value;
    goto LAB_001810ca;
  case (crate *)0x16:
    uStack_1f4 = (float)(int)cVar11;
    local_1f8 = (undefined1  [4])(int)cVar8;
    linb::any::operator=((any *)value,(array<int,_2UL> *)local_1f8);
    break;
  case (crate *)0x17:
    _local_1f8 = (_Type)(double)(int)cVar8;
    uStack_1f0 = (double)(int)((long)(uVar1 << 0x30) >> 0x38);
    local_1e8._M_allocated_capacity = (size_type)(double)(int)cVar9;
    linb::any::operator=((any *)value,(array<double,_3UL> *)local_1f8);
    break;
  case (crate *)0x18:
    local_1f8 = (undefined1  [4])(float)(int)cVar8;
    uStack_1f4 = (float)(int)((long)(uVar1 << 0x30) >> 0x38);
    uStack_1f0 = (double)CONCAT44(uStack_1f0._4_4_,(float)(int)cVar9);
    linb::any::operator=((any *)value,(array<float,_3UL> *)local_1f8);
    break;
  case (crate *)0x19:
    hVar3 = tinyusdz::value::float_to_half_full((float)(int)cVar8);
    local_1f8._0_2_ = hVar3.value;
    hVar3 = tinyusdz::value::float_to_half_full((float)(int)cVar11);
    local_1f8._2_2_ = hVar3.value;
    hVar3 = tinyusdz::value::float_to_half_full((float)(int)cVar9);
    uStack_1f4._0_2_ = hVar3.value;
LAB_001810ca:
    linb::any::operator=((any *)value,(array<tinyusdz::value::half,_3UL> *)local_1f8);
    break;
  case (crate *)0x1a:
    uStack_1f4 = (float)(int)cVar11;
    local_1f8 = (undefined1  [4])(int)cVar8;
    uStack_1f0 = (double)CONCAT44(uStack_1f0._4_4_,(int)cVar9);
    linb::any::operator=((any *)value,(array<int,_3UL> *)local_1f8);
    break;
  case (crate *)0x1b:
    _local_1f8 = (_Type)(double)(int)cVar8;
    uStack_1f0 = (double)(int)((long)(uVar1 << 0x30) >> 0x38);
    local_1e8._M_allocated_capacity = (size_type)(double)(int)cVar9;
    local_1e8._8_8_ = (undefined8)iVar10;
    linb::any::operator=((any *)value,(array<double,_4UL> *)local_1f8);
    break;
  case (crate *)0x1c:
    uVar2 = extraout_XMM0_Qa & 0xffff0000ffff | (ulong)(ushort)(token_index.value << 8) << 0x10;
    uStack_1f4 = (float)(int)((long)(uVar2 | uVar1 << 0x30) >> 0x38);
    local_1f8 = (undefined1  [4])(float)((int)uVar2 >> 0x18);
    uStack_1f0 = (double)CONCAT44((float)((int)((uint)((extraout_XMM0_Qb & 0xffff0000ffff) >> 0x20)
                                               | (uint)(((uVar1 >> 0x10) << 0x30) >> 0x20)) >> 0x18)
                                  ,(float)((int)((uint)(extraout_XMM0_Qb & 0xffff0000ffff) |
                                                (uint)((uVar1 >> 8 & 0xffff) << 0x10)) >> 0x18));
    linb::any::operator=((any *)value,(array<float,_4UL> *)local_1f8);
    break;
  case (crate *)0x1d:
    local_244 = (float)(int)cVar8;
    hVar3 = tinyusdz::value::float_to_half_full(local_244);
    local_1f8._0_2_ = hVar3.value;
    hVar3 = tinyusdz::value::float_to_half_full(local_244);
    local_1f8._2_2_ = hVar3.value;
    hVar3 = tinyusdz::value::float_to_half_full(local_244);
    uStack_1f4._0_2_ = hVar3.value;
    hVar3 = tinyusdz::value::float_to_half_full(local_244);
    uStack_1f4._2_2_ = hVar3.value;
    linb::any::operator=((any *)value,(array<tinyusdz::value::half,_4UL> *)local_1f8);
    break;
  case (crate *)0x1e:
    uStack_1f4 = (float)(int)cVar11;
    local_1f8 = (undefined1  [4])(int)cVar8;
    uStack_1f0 = (double)CONCAT44(iVar10,(int)cVar9);
    linb::any::operator=((any *)value,(array<int,_4UL> *)local_1f8);
    break;
  case (crate *)0x1f:
    local_1e8._8_8_ = &uStack_1f0;
    uStack_1f0 = (double)((ulong)(uint)uStack_1f0._4_4_ << 0x20);
    local_1e8._M_allocated_capacity = 0;
    local_1d0 = 0.0;
    _Stack_1d8._M_p = (pointer)local_1e8._8_8_;
    linb::any::operator=
              ((any *)value,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)local_1f8);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 *)local_1f8);
    break;
  case (crate *)0x20:
  case (crate *)0x21:
  case (crate *)0x22:
  case (crate *)0x23:
  case (crate *)0x24:
  case (crate *)0x25:
  case (crate *)0x26:
  case (crate *)0x27:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x8f8);
    ::std::operator<<(poVar4," ");
    pcVar12 = "ListOp data type `{}` cannot be inlined.";
    goto LAB_001808f7;
  default:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,"[Crate]");
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x904);
    ::std::operator<<(poVar4," ");
    pcVar12 = "Data type `{}` cannot be inlined.";
LAB_001808f7:
    ::std::__cxx11::string::string((string *)&local_218,pcVar12,&local_245);
    GetCrateDataTypeName_abi_cxx11_(&local_50,this_00,did);
    fmt::format<std::__cxx11::string>
              ((string *)&local_240,(fmt *)&local_218,(string *)&local_50,args);
    poVar4 = ::std::operator<<((ostream *)local_1f8,(string *)&local_240);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
LAB_00180954:
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    goto LAB_00180816;
  case (crate *)0x2a:
    if (2 < token_index.value) {
LAB_00181126:
      ::std::__cxx11::string::append((char *)&this->_err);
      goto LAB_0018084a;
    }
    local_1f8._0_2_ = (short)token_index.value;
    local_1f8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(Specifier *)local_1f8);
    break;
  case (crate *)0x2b:
    if (1 < token_index.value) goto LAB_00181126;
    local_1f8._0_2_ = (short)token_index.value;
    local_1f8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(Permission *)local_1f8);
    break;
  case (crate *)0x2c:
    if (2 < token_index.value) goto LAB_00181126;
    local_1f8._0_2_ = (short)token_index.value;
    local_1f8._2_2_ = (short)(token_index.value >> 0x10);
    linb::any::operator=((any *)value,(Variability *)local_1f8);
    break;
  case (crate *)0x33:
    linb::any::operator=((any *)value,(ValueBlock *)local_1f8);
    break;
  case (crate *)0x34:
  case (crate *)0x35:
  case (crate *)0x36:
  case (crate *)0x38:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar4 = ::std::operator<<((ostream *)local_1f8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"UnpackInlinedValueRep");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x90d);
    ::std::operator<<(poVar4," ");
    GetCrateDataTypeName_abi_cxx11_(&local_218,this_00,did_00);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240
                     ,
                     "Invalid data type(or maybe not supported in TinyUSDZ yet) for Inlined value: "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_218);
    poVar4 = ::std::operator<<((ostream *)local_1f8,(string *)&local_240);
    ::std::operator<<(poVar4,"\n");
    goto LAB_00180954;
  }
  cVar11 = '\x01';
LAB_0018084c:
  nonstd::expected_lite::
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&local_78);
  return (bool)cVar11;
}

Assistant:

bool CrateReader::UnpackInlinedValueRep(const crate::ValueRep &rep,
                                        crate::CrateValue *value) {
  if (!rep.IsInlined()) {
    PUSH_ERROR("ValueRep must be inlined value representation.");
    return false;
  }

  const auto tyRet = crate::GetCrateDataType(rep.GetType());
  if (!tyRet) {
    PUSH_ERROR(tyRet.error());
    return false;
  }

  if (rep.IsCompressed()) {
    PUSH_ERROR("Inlinved value must not be compressed.");
    return false;
  }

  if (rep.IsArray()) {
    PUSH_ERROR("Inlined value must not be an array.");
    return false;
  }

  const auto dty = tyRet.value();
  DCOUT(crate::GetCrateDataTypeRepr(dty));

  uint32_t d = (rep.GetPayload() & ((1ull << (sizeof(uint32_t) * 8)) - 1));
  DCOUT("d = " << d);

  // TODO(syoyo): Use template SFINE?
  switch (dty.dtype_id) {
    case crate::CrateDataTypeId::NumDataTypes:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INVALID: {
      PUSH_ERROR("`Invalid` DataType.");
      return false;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_BOOL: {
      value->Set(d ? true : false);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH: {
      // AssetPath = TokenIndex for inlined value.
      if (auto v = GetToken(crate::Index(d))) {
        std::string str = v.value().str();

        value::AssetPath assetp(str);
        value->Set(assetp);
        return true;
      } else {
        PUSH_ERROR("Invalid Index for AssetPath.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN: {
      if (auto v = GetToken(crate::Index(d))) {
        value::token tok = v.value();

        DCOUT("value.token = " << tok);

        value->Set(tok);

        return true;
      } else {
        PUSH_ERROR("Invalid Index for Token.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING: {
      if (auto v = GetStringToken(crate::Index(d))) {
        std::string str = v.value().str();

        DCOUT("value.string = " << str);

        value->Set(str);

        return true;
      } else {
        PUSH_ERROR("Invalid Index for StringToken.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_SPECIFIER: {
      if (d >= static_cast<int>(Specifier::Invalid)) {
        _err += "Invalid value for Specifier\n";
        return false;
      }
      Specifier val = static_cast<Specifier>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PERMISSION: {
      if (d >= static_cast<int>(Permission::Invalid)) {
        _err += "Invalid value for Permission\n";
        return false;
      }
      Permission val = static_cast<Permission>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VARIABILITY: {
      if (d >= static_cast<int>(Variability::Invalid)) {
        _err += "Invalid value for Variability\n";
        return false;
      }
      Variability val = static_cast<Variability>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UCHAR: {
      uint8_t val;
      memcpy(&val, &d, 1);

      DCOUT("value.uchar = " << val);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT: {
      int ival;
      memcpy(&ival, &d, sizeof(int));

      DCOUT("value.int = " << ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT: {
      uint32_t val;
      memcpy(&val, &d, sizeof(uint32_t));

      DCOUT("value.uint = " << val);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT64: {
      // stored as int
      int _ival;
      memcpy(&_ival, &d, sizeof(int));

      DCOUT("value.int = " << _ival);

      int64_t ival = static_cast<int64_t>(_ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT64: {
      // stored as uint32
      uint32_t _ival;
      memcpy(&_ival, &d, sizeof(uint32_t));

      DCOUT("value.int = " << _ival);

      uint64_t ival = static_cast<uint64_t>(_ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_HALF: {
      value::half f;
      memcpy(&f, &d, sizeof(value::half));

      DCOUT("value.half = " << f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_FLOAT: {
      float f;
      memcpy(&f, &d, sizeof(float));

      DCOUT("value.float = " << f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE: {
      // stored as float
      float _f;
      memcpy(&_f, &d, sizeof(float));

      double f = static_cast<double>(_f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::matrix2d v;
      memset(v.m, 0, sizeof(value::matrix2d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << "\n");

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::matrix3d v;
      memset(v.m, 0, sizeof(value::matrix3d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);
      v.m[2][2] = static_cast<double>(data[2]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << ", "
                                    << v.m[2][2] << "\n");

      value->Set(v);

      return true;
    }

    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::matrix4d v;
      memset(v.m, 0, sizeof(value::matrix4d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);
      v.m[2][2] = static_cast<double>(data[2]);
      v.m[3][3] = static_cast<double>(data[3]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << ", "
                                    << v.m[2][2] << ", " << v.m[3][3]);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATD:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATF:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATH: {
      // Seems quaternion type is not allowed for Inlined Value.
      PUSH_ERROR("Quaternion type is not allowed for Inlined Value.");
      return false;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2D: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::double2 v;
      v[0] = double(data[0]);
      v[1] = double(data[1]);

      DCOUT("value.double2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2F: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::float2 v;
      v[0] = float(data[0]);
      v[1] = float(data[1]);

      DCOUT("value.float2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2H: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::half3 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[1]));

      DCOUT("value.half2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2I: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::int2 v;
      v[0] = int(data[0]);
      v[1] = int(data[1]);

      DCOUT("value.int2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3D: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::double3 v;
      v[0] = double(data[0]);
      v[1] = double(data[1]);
      v[2] = double(data[2]);

      DCOUT("value.double3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3F: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::float3 v;
      v[0] = float(data[0]);
      v[1] = float(data[1]);
      v[2] = float(data[2]);

      DCOUT("value.float3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3H: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::half3 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[1]));
      v[2] = value::float_to_half_full(float(data[2]));

      DCOUT("value.half3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3I: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::int3 v;
      v[0] = static_cast<int32_t>(data[0]);
      v[1] = static_cast<int32_t>(data[1]);
      v[2] = static_cast<int32_t>(data[2]);

      DCOUT("value.int3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4D: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::double4 v;
      v[0] = static_cast<double>(data[0]);
      v[1] = static_cast<double>(data[1]);
      v[2] = static_cast<double>(data[2]);
      v[3] = static_cast<double>(data[3]);

      DCOUT("value.doublef = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4F: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::float4 v;
      v[0] = static_cast<float>(data[0]);
      v[1] = static_cast<float>(data[1]);
      v[2] = static_cast<float>(data[2]);
      v[3] = static_cast<float>(data[3]);

      DCOUT("value.vec4f = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4H: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::half4 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[0]));
      v[2] = value::float_to_half_full(float(data[0]));
      v[3] = value::float_to_half_full(float(data[0]));

      DCOUT("value.vec4h = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4I: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::int4 v;
      v[0] = static_cast<int32_t>(data[0]);
      v[1] = static_cast<int32_t>(data[1]);
      v[2] = static_cast<int32_t>(data[2]);
      v[3] = static_cast<int32_t>(data[3]);

      DCOUT("value.vec4i = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DICTIONARY: {
      // empty dict is allowed
      // TODO: empty(zero value) check?
      //crate::CrateValue::Dictionary dict;
      CustomDataType dict; // use CustomDataType for Dict
      value->Set(dict);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VALUE_BLOCK: {
      // Guess No content for ValueBlock
      value::ValueBlock block;
      value->Set(block);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PATH_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_REFERENCE_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT64_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT64_LIST_OP: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("ListOp data type `{}` cannot be inlined.",
          crate::GetCrateDataTypeName(dty.dtype_id)));
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PATH_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VARIANT_SELECTION_MAP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TIME_SAMPLES:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_LAYER_OFFSET_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING_VECTOR: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Data type `{}` cannot be inlined.",
          crate::GetCrateDataTypeName(dty.dtype_id)));
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VALUE:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE: {
      PUSH_ERROR(
          "Invalid data type(or maybe not supported in TinyUSDZ yet) for "
          "Inlined value: " +
          crate::GetCrateDataTypeName(dty.dtype_id));
      return false;
    }
  }

  // Should never reach here.
  return false;
}